

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O2

void __thiscall LinearExpert::e_step(LinearExpert *this,Z *z,X *x,Scal h)

{
  Scal decay;
  X xh;
  Z zh;
  double local_98;
  double local_90;
  double local_88;
  XZ *local_80;
  void *local_78 [2];
  void *local_68 [2];
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_58;
  Z *local_50;
  double local_40;
  
  local_90 = h;
  local_88 = pow(this->H + h,this->alpha);
  local_88 = local_88 - local_90;
  local_98 = pow(this->H,this->alpha);
  local_98 = local_88 / local_98;
  this->H = this->H + local_90;
  local_50 = (Z *)(z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows;
  local_40 = local_90;
  local_88 = local_98;
  local_58 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)z;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_68,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_58);
  local_50 = (Z *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows;
  local_40 = local_90;
  local_58 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)x;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_78,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_58);
  this->Sh = local_88 * this->Sh + local_90;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Sz,&local_98);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->Sz,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_68);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Sx,&local_98);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->Sx,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_78);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->Sxz,&local_98);
  local_80 = &this->Sxz;
  local_58 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_78;
  local_50 = z;
  Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator+=
            ((NoAlias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixBase> *)&local_80,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
              *)&local_58);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->Szz,&local_98);
  local_80 = &this->Szz;
  local_58 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_68;
  local_50 = z;
  Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator+=
            ((NoAlias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixBase> *)&local_80,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
              *)&local_58);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Sxx,&local_98);
  local_58 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_78;
  local_50 = x;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->Sxx,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_58);
  this->wPsi = this->wPsi * local_98;
  this->wNu = this->wNu * local_98;
  this->wSigma = this->wSigma * local_98;
  this->wLambda = this->wLambda * local_98;
  free(local_78[0]);
  free(local_68[0]);
  return;
}

Assistant:

EXPERT_CLASS_TEMPLATE
void LINEAR_EXPERT_base::e_step( Z const &z, X const &x, Scal h )
{
    Scal decay = (pow(H+h,alpha) - h) / pow(H,alpha);

    H += h;

    Z zh = z * h;
	X xh = x * h;

	Sh  *= decay; Sh  += h;
	Sz  *= decay; Sz  += zh;
	Sx  *= decay; Sx  += xh;
	Sxz *= decay; Sxz.noalias() += xh * z.transpose();
	Szz *= decay; Szz.noalias() += zh * z.transpose();
	Sxx *= decay; Sxx += xh.cwiseProduct(x);

    wPsi *= decay;
    wNu *= decay;
    wSigma *= decay;
    wLambda *= decay;
}